

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

int consume_data(j_decompress_ptr cinfo)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_d_coef_controller *pjVar3;
  long lVar4;
  jpeg_entropy_decoder *pjVar5;
  boolean bVar6;
  int iVar7;
  JBLOCKARRAY ppaJVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  _func_void_j_decompress_ptr *p_Var13;
  long lVar14;
  long lVar15;
  JBLOCKARRAY buffer [4];
  long local_68;
  long alStack_58 [5];
  
  pjVar3 = cinfo->coef;
  if (0 < cinfo->comps_in_scan) {
    lVar15 = 0;
    do {
      JVar1 = cinfo->cur_comp_info[lVar15]->v_samp_factor;
      ppaJVar8 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,
                            (jvirt_barray_ptr)
                            (&pjVar3[3].decompress_data)
                            [cinfo->cur_comp_info[lVar15]->component_index],
                            cinfo->input_iMCU_row * JVar1,JVar1,1);
      alStack_58[lVar15] = (long)ppaJVar8;
      lVar15 = lVar15 + 1;
    } while (lVar15 < cinfo->comps_in_scan);
  }
  iVar7 = *(int *)((long)&pjVar3[1].start_input_pass + 4);
  local_68 = (long)iVar7;
  if (iVar7 < *(int *)&pjVar3[1].consume_data) {
    do {
      uVar10 = *(uint *)&pjVar3[1].start_input_pass;
      if (uVar10 < cinfo->MCUs_per_row) {
        do {
          iVar7 = cinfo->comps_in_scan;
          if (0 < (long)iVar7) {
            lVar15 = 0;
            iVar9 = 0;
            do {
              lVar11 = (long)cinfo->cur_comp_info[lVar15]->MCU_height;
              if (0 < lVar11) {
                iVar2 = cinfo->cur_comp_info[lVar15]->MCU_width;
                lVar4 = alStack_58[lVar15];
                lVar12 = 0;
                do {
                  if (0 < iVar2) {
                    p_Var13 = (_func_void_j_decompress_ptr *)
                              (*(long *)(lVar4 + local_68 * 8 + lVar12 * 8) +
                              (ulong)(iVar2 * uVar10) * 0x80);
                    lVar14 = 0;
                    do {
                      (&pjVar3[1].start_output_pass)[iVar9 + lVar14] = p_Var13;
                      p_Var13 = p_Var13 + 0x80;
                      lVar14 = lVar14 + 1;
                    } while (iVar2 != (int)lVar14);
                    iVar9 = iVar9 + (int)lVar14;
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar12 != lVar11);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != iVar7);
          }
          pjVar5 = cinfo->entropy;
          if (pjVar5->insufficient_data == 0) {
            cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
          }
          bVar6 = (*pjVar5->decode_mcu)(cinfo,(JBLOCKROW *)&pjVar3[1].start_output_pass);
          if (bVar6 == 0) {
            *(int *)((long)&pjVar3[1].start_input_pass + 4) = (int)local_68;
            *(uint *)&pjVar3[1].start_input_pass = uVar10;
            return 0;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < cinfo->MCUs_per_row);
      }
      *(undefined4 *)&pjVar3[1].start_input_pass = 0;
      local_68 = local_68 + 1;
    } while (local_68 < *(int *)&pjVar3[1].consume_data);
  }
  uVar10 = cinfo->input_iMCU_row + 1;
  cinfo->input_iMCU_row = uVar10;
  if (uVar10 < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    iVar7 = 3;
  }
  else {
    (*cinfo->inputctl->finish_input_pass)(cinfo);
    iVar7 = 4;
  }
  return iVar7;
}

Assistant:

METHODDEF(int)
consume_data(j_decompress_ptr cinfo)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  int blkn, ci, xindex, yindex, yoffset;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[compptr->component_index],
       cinfo->input_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, TRUE);
    /* Note: entropy decoder expects buffer to be zeroed,
     * but this is handled automatically by the memory manager
     * because we requested a pre-zeroed array.
     */
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num < cinfo->MCUs_per_row;
         MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;                 /* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
        compptr = cinfo->cur_comp_info[ci];
        start_col = MCU_col_num * compptr->MCU_width;
        for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
          buffer_ptr = buffer[ci][yindex + yoffset] + start_col;
          for (xindex = 0; xindex < compptr->MCU_width; xindex++) {
            coef->MCU_buffer[blkn++] = buffer_ptr++;
          }
        }
      }
      if (!cinfo->entropy->insufficient_data)
        cinfo->master->last_good_iMCU_row = cinfo->input_iMCU_row;
      /* Try to fetch the MCU. */
      if (!(*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->MCU_ctr = MCU_col_num;
        return JPEG_SUSPENDED;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}